

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Packet.cpp
# Opt level: O3

Packet * __thiscall mognetwork::Packet::operator>>(Packet *this,string *data)

{
  uint uVar1;
  pointer pcVar2;
  ulong uVar3;
  void *__dest;
  uint uVar4;
  ulong __n;
  
  uVar4 = this->m_readerPos + 4;
  pcVar2 = (this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (long)(this->m_data->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar2;
  if (uVar4 <= uVar3) {
    uVar1 = *(uint *)(pcVar2 + this->m_readerPos);
    __n = (ulong)uVar1;
    this->m_readerPos = uVar4;
    if ((0 < (int)uVar1) && (uVar4 + uVar1 <= uVar3)) {
      __dest = operator_new__(__n + 1);
      memcpy(__dest,pcVar2 + uVar4,__n);
      *(undefined1 *)((long)__dest + __n) = 0;
      this->m_readerPos = uVar4 + uVar1;
      std::__cxx11::string::append((char *)data);
      operator_delete(__dest);
    }
  }
  return this;
}

Assistant:

Packet& Packet::operator>>(std::string& data)
  {
    int32_t size = 0;
    *this >> size;

    if (size > 0 && verifySize(size))
      {
	char *buffer = new char[size + 1];
	memcpy(buffer, &((*m_data)[m_readerPos]), size);
	buffer[size] = '\0';
	m_readerPos += size;
	data.append(buffer);
	delete buffer;
      }
    return (*this);
  }